

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::OutputTestCases(JunitReporter *this,XmlWriter *xml,Stats *stats)

{
  pointer pTVar1;
  pointer stats_00;
  ScopedElement e;
  string stdOut;
  string stdErr;
  allocator local_a9;
  undefined1 local_a8 [16];
  JunitReporter *local_98;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  string local_50;
  
  pTVar1 = (stats->m_testCaseStats).
           super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = this;
  for (stats_00 = (stats->m_testCaseStats).
                  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
                  ._M_impl.super__Vector_impl_data._M_start; stats_00 != pTVar1;
      stats_00 = stats_00 + 1) {
    std::__cxx11::string::string((string *)&local_90,"testcase",(allocator *)&local_50);
    XmlWriter::scopedElement((XmlWriter *)(local_a8 + 8),(string *)xml);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_90,"classname",(allocator *)&local_50);
    XmlWriter::writeAttribute(xml,&local_90,&stats_00->m_className);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_50);
    XmlWriter::writeAttribute(xml,&local_90,&stats_00->m_name);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_90,"time",(allocator *)&local_50);
    XmlWriter::writeAttribute<char[4]>(xml,&local_90,(char (*) [4])"tbd");
    std::__cxx11::string::~string((string *)&local_90);
    OutputTestResult(local_98,xml,stats_00);
    trim(&local_90,&stats_00->m_stdOut);
    if ((pointer)local_90._M_string_length != (pointer)0x0) {
      std::__cxx11::string::string((string *)&local_50,"system-out",(allocator *)local_a8);
      XmlWriter::scopedElement((XmlWriter *)local_70,(string *)xml);
      XmlWriter::writeText((XmlWriter *)local_70[0]._0_8_,&local_90,false);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70[0]._M_allocated_capacity);
      std::__cxx11::string::~string((string *)&local_50);
    }
    trim(&local_50,&stats_00->m_stdErr);
    if (local_50._M_string_length != 0) {
      std::__cxx11::string::string((string *)local_70[0]._M_local_buf,"system-err",&local_a9);
      XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)xml);
      XmlWriter::writeText((XmlWriter *)local_a8._0_8_,&local_50,false);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
      std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_a8 + 8));
  }
  return;
}

Assistant:

void OutputTestCases( XmlWriter& xml, const Stats& stats ) {
            std::vector<TestCaseStats>::const_iterator it = stats.m_testCaseStats.begin();
            std::vector<TestCaseStats>::const_iterator itEnd = stats.m_testCaseStats.end();
            for(; it != itEnd; ++it ) {

                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                xml.writeAttribute( "classname", it->m_className );
                xml.writeAttribute( "name", it->m_name );
                xml.writeAttribute( "time", "tbd" );

                OutputTestResult( xml, *it );

                std::string stdOut = trim( it->m_stdOut );
                if( !stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( stdOut, false );
                std::string stdErr = trim( it->m_stdErr );
                if( !stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( stdErr, false );
            }
        }